

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

NodeBase * __thiscall
SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::UnlinkCurrentNode
          (EditingIterator *this)

{
  NodeBase *pNVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type_conflict pSVar5;
  Type_conflict *ppSVar6;
  NodeBase *unlinkedNode;
  EditingIterator *this_local;
  
  pNVar1 = (this->super_Iterator).current;
  if ((this->super_Iterator).current == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x101,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar3 = SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                    ((this->super_Iterator).list,(this->super_Iterator).current);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x102,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->last == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x103,"(last != nullptr)","last != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next((this->super_Iterator).current);
  ppSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next(this->last);
  *ppSVar6 = pSVar5;
  (this->super_Iterator).current = this->last;
  this->last = (NodeBase *)0x0;
  RealCount::DecrementCount(&((this->super_Iterator).list)->super_RealCount);
  return pNVar1;
}

Assistant:

NodeBase * UnlinkCurrentNode()
        {
            NodeBase * unlinkedNode = const_cast<NodeBase *>(this->current);
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));
            Assert(last != nullptr);

            const_cast<NodeBase *>(last)->Next() = this->current->Next();
            this->current = last;
            last = nullptr;
            const_cast<SListBase *>(this->list)->DecrementCount();
            return unlinkedNode;
        }